

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeAddrMode2IdxInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t Imm12;
  uint32_t Val;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  DecodeStatus DVar7;
  uint32_t uVar8;
  bool bVar9;
  bool bVar10;
  uint tmp;
  uint amt;
  uint idx_mode;
  uint W;
  uint P;
  uint reg;
  uint pred;
  uint imm;
  uint Rm;
  uint Rt;
  uint Rn;
  ARM_AM_AddrOpc AStack_38;
  _Bool writeback;
  ARM_AM_ShiftOpc Opc;
  ARM_AM_AddrOpc Op;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Opc = ARM_AM_lsr;
  _Op = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0x10,4);
  RegNo = fieldFromInstruction_4(Address_local._4_4_,0xc,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  Imm12 = fieldFromInstruction_4(Address_local._4_4_,0,0xc);
  Val = fieldFromInstruction_4(Address_local._4_4_,0x1c,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x19,1);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0x18,1);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,0x15,1);
  tmp = 0;
  uVar6 = MCInst_getOpcode(pMStack_18);
  if ((uVar6 - 0x19e < 4) || (uVar6 - 0x1b6 < 4)) {
    DVar7 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Op);
    _Var1 = Check(&Opc,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  DVar7 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Op);
  _Var1 = Check(&Opc,DVar7);
  if (_Var1) {
    uVar6 = MCInst_getOpcode(pMStack_18);
    if ((uVar6 - 0x98 < 4) || (uVar6 - 0xba < 4)) {
      DVar7 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Op);
      _Var1 = Check(&Opc,DVar7);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar7 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Op);
    _Var1 = Check(&Opc,DVar7);
    if (_Var1) {
      uVar8 = fieldFromInstruction_4(Address_local._4_4_,0x17,1);
      AStack_38 = (ARM_AM_AddrOpc)(uVar8 != 0);
      bVar9 = uVar4 == 0;
      bVar10 = uVar5 == 1;
      if ((uVar4 == 0) || (!bVar9 && !bVar10)) {
        if ((uVar4 == 0) && (bVar9 || bVar10)) {
          tmp = 2;
        }
      }
      else {
        tmp = 1;
      }
      if ((bVar9 || bVar10) && ((uVar2 == 0xf || (uVar2 == RegNo)))) {
        Opc = ARM_AM_asr;
      }
      if (uVar3 == 0) {
        MCOperand_CreateReg0(pMStack_18,0);
        uVar6 = ARM_AM_getAM2Opc(AStack_38,Imm12,ARM_AM_lsl,tmp);
        MCOperand_CreateImm0(pMStack_18,(ulong)uVar6);
      }
      else {
        DVar7 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Op);
        _Var1 = Check(&Opc,DVar7);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
        uVar2 = fieldFromInstruction_4(Address_local._4_4_,5,2);
        switch(uVar2) {
        case 0:
          Rn = 2;
          break;
        case 1:
          Rn = 3;
          break;
        case 2:
          Rn = 1;
          break;
        case 3:
          Rn = 4;
          break;
        default:
          return MCDisassembler_Fail;
        }
        uVar2 = fieldFromInstruction_4(Address_local._4_4_,7,5);
        if ((Rn == 4) && (uVar2 == 0)) {
          Rn = 5;
        }
        uVar6 = ARM_AM_getAM2Opc(AStack_38,uVar2,Rn,tmp);
        MCOperand_CreateImm0(pMStack_18,(ulong)uVar6);
      }
      DVar7 = DecodePredicateOperand(pMStack_18,Val,(uint64_t)Decoder_local,_Op);
      _Var1 = Check(&Opc,DVar7);
      if (_Var1) {
        Inst_local._4_4_ = Opc;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeAddrMode2IdxInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_AddrOpc Op;
	ARM_AM_ShiftOpc Opc;
	bool writeback;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned reg = fieldFromInstruction_4(Insn, 25, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned idx_mode = 0, amt, tmp;

	// On stores, the writeback operand precedes Rt.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STR_POST_IMM:
		case ARM_STR_POST_REG:
		case ARM_STRB_POST_IMM:
		case ARM_STRB_POST_REG:
		case ARM_STRT_POST_REG:
		case ARM_STRT_POST_IMM:
		case ARM_STRBT_POST_REG:
		case ARM_STRBT_POST_IMM:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;

	// On loads, the writeback operand comes after Rt.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDR_POST_IMM:
		case ARM_LDR_POST_REG:
		case ARM_LDRB_POST_IMM:
		case ARM_LDRB_POST_REG:
		case ARM_LDRBT_POST_REG:
		case ARM_LDRBT_POST_IMM:
		case ARM_LDRT_POST_REG:
		case ARM_LDRT_POST_IMM:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	Op = ARM_AM_add;
	if (!fieldFromInstruction_4(Insn, 23, 1))
		Op = ARM_AM_sub;

	writeback = (P == 0) || (W == 1);
	if (P && writeback)
		idx_mode = ARMII_IndexModePre;
	else if (!P && writeback)
		idx_mode = ARMII_IndexModePost;

	if (writeback && (Rn == 15 || Rn == Rt))
		S = MCDisassembler_SoftFail; // UNPREDICTABLE

	if (reg) {
		if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
		Opc = ARM_AM_lsl;
		switch( fieldFromInstruction_4(Insn, 5, 2)) {
			case 0:
				Opc = ARM_AM_lsl;
				break;
			case 1:
				Opc = ARM_AM_lsr;
				break;
			case 2:
				Opc = ARM_AM_asr;
				break;
			case 3:
				Opc = ARM_AM_ror;
				break;
			default:
				return MCDisassembler_Fail;
		}
		amt = fieldFromInstruction_4(Insn, 7, 5);
		if (Opc == ARM_AM_ror && amt == 0)
			Opc = ARM_AM_rrx;
		imm = ARM_AM_getAM2Opc(Op, amt, Opc, idx_mode);

		MCOperand_CreateImm0(Inst, imm);
	} else {
		MCOperand_CreateReg0(Inst, 0);
		tmp = ARM_AM_getAM2Opc(Op, imm, ARM_AM_lsl, idx_mode);
		MCOperand_CreateImm0(Inst, tmp);
	}

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}